

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_wait_release.h
# Opt level: O1

__pid_t __thiscall kmp_flag_64::wait(kmp_flag_64 *this,void *__stat_loc)

{
  kmp_int32 gtid;
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  undefined1 *puVar7;
  void *in_RCX;
  int in_EDX;
  int iVar8;
  int tasks_completed;
  kmp_uint32 local_5c;
  int local_4c;
  unsigned_long_long *local_48;
  ulong local_40;
  void *local_38;
  
  local_48 = (this->super_kmp_basic_flag<unsigned_long_long>).super_kmp_flag<unsigned_long_long>.loc
  ;
  local_4c = 0;
  if (*(this->super_kmp_basic_flag<unsigned_long_long>).super_kmp_flag<unsigned_long_long>.loc ==
      (this->super_kmp_basic_flag<unsigned_long_long>).checker) {
    puVar7 = __kmp_itt_fsync_acquired_ptr__3_0;
    if (0 < __kmp_itt_prepare_delay || __kmp_itt_fsync_acquired_ptr__3_0 == (undefined1 *)0x0)
    goto LAB_001408c7;
  }
  else {
    gtid = *(kmp_int32 *)((long)__stat_loc + 0x24);
    local_5c = __kmp_yield_init;
    local_38 = in_RCX;
    if (__kmp_dflt_blocktime != 0x7fffffff) {
      lVar5 = __kmp_hardware_timestamp();
      local_40 = lVar5 + *(long *)((long)__stat_loc + 0x88);
    }
    iVar4 = __kmp_nth;
    iVar3 = __kmp_avail_proc;
    iVar8 = 0;
    do {
      if (*(this->super_kmp_basic_flag<unsigned_long_long>).super_kmp_flag<unsigned_long_long>.loc
          == (this->super_kmp_basic_flag<unsigned_long_long>).checker) break;
      if (__kmp_tasking_mode == tskm_immediate_exec) {
LAB_0014074f:
        lVar5 = 0;
      }
      else {
        lVar5 = *(long *)((long)__stat_loc + 0x170);
        if (lVar5 == 0) {
          *(undefined4 *)((long)__stat_loc + 0x198) = 1;
          goto LAB_0014074f;
        }
        if (*(int *)(lVar5 + 0xc0) == 0) {
          *(undefined8 *)((long)__stat_loc + 0x170) = 0;
LAB_00140760:
          *(undefined4 *)((long)__stat_loc + 0x198) = 1;
        }
        else {
          if (*(int *)(lVar5 + 0x50) != 1) goto LAB_00140760;
          __kmp_execute_tasks_64((kmp_info_t *)__stat_loc,gtid,this,in_EDX,&local_4c,local_38,0);
        }
      }
      if (((__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) &&
          (iVar8 < __kmp_itt_prepare_delay)) &&
         (iVar8 = iVar8 + 1, __kmp_itt_prepare_delay <= iVar8)) {
        (*(code *)__kmp_itt_fsync_prepare_ptr__3_0)(local_48);
      }
      if (__kmp_global.g.g_done == 0) {
        if (iVar3 < iVar4) {
          __kmp_yield(1);
        }
        else {
          local_5c = local_5c - 2;
          if (local_5c == 0) {
            __kmp_yield(1);
            local_5c = __kmp_yield_next;
          }
        }
        iVar1 = *(int *)((long)__stat_loc + 0x60);
        if ((*(char *)((long)__stat_loc + 0x19c) == '\0') == (iVar1 != 0)) {
          if (iVar1 == 0) {
            LOCK();
            __kmp_thread_pool_active_nth = __kmp_thread_pool_active_nth + -1;
            UNLOCK();
          }
          else {
            LOCK();
            __kmp_thread_pool_active_nth = __kmp_thread_pool_active_nth + 1;
            UNLOCK();
          }
          *(bool *)((long)__stat_loc + 0x19c) = iVar1 != 0;
        }
        if (((__kmp_dflt_blocktime != 0x7fffffff) && ((lVar5 == 0 || (*(int *)(lVar5 + 0x50) == 0)))
            ) && (uVar6 = __kmp_hardware_timestamp(), local_40 <= uVar6)) {
          __kmp_suspend_64(gtid,this);
          if (__kmp_global.g.g_done != 0) goto LAB_0014079e;
          if ((__kmp_tasking_mode != tskm_immediate_exec) &&
             (*(int *)((long)__stat_loc + 0x198) == 1)) {
            *(undefined4 *)((long)__stat_loc + 0x198) = 0;
          }
        }
        bVar2 = false;
      }
      else {
LAB_0014079e:
        bVar2 = true;
        if (__kmp_global.g.g_abort != 0) {
          __kmp_abort_thread();
        }
      }
    } while (!bVar2);
    puVar7 = __kmp_itt_fsync_acquired_ptr__3_0;
    if (__kmp_itt_fsync_acquired_ptr__3_0 == (undefined1 *)0x0 || iVar8 < __kmp_itt_prepare_delay)
    goto LAB_001408c7;
  }
  puVar7 = (undefined1 *)(*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(local_48);
LAB_001408c7:
  return (__pid_t)puVar7;
}

Assistant:

void wait(kmp_info_t *this_thr,
            int final_spin USE_ITT_BUILD_ARG(void *itt_sync_obj)) {
    __kmp_wait_template(this_thr, this,
                        final_spin USE_ITT_BUILD_ARG(itt_sync_obj));
  }